

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O3

void parse_diagnostics(options_i *options,vw *all)

{
  vw_ostream *pvVar1;
  _func_int **pp_Var2;
  bool bVar3;
  double dVar4;
  options_i *poVar5;
  int iVar6;
  option_group_definition *poVar7;
  long lVar8;
  ostream *poVar9;
  float fVar10;
  bool version_arg;
  bool help;
  string progress_arg;
  option_group_definition diagnostic_group;
  bool local_57a;
  bool local_579;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  bool *local_558;
  options_i *local_550;
  string local_548;
  undefined1 *local_528 [2];
  undefined1 local_518 [16];
  undefined1 *local_508 [2];
  undefined1 local_4f8 [16];
  string local_4e8;
  undefined1 *local_4c8 [2];
  undefined1 local_4b8 [16];
  undefined1 *local_4a8 [2];
  undefined1 local_498 [16];
  string local_488;
  undefined1 *local_468 [2];
  undefined1 local_458 [16];
  string local_448;
  undefined1 *local_428;
  long local_420;
  undefined1 local_418 [16];
  option_group_definition local_408;
  undefined1 *local_3d0 [2];
  undefined1 local_3c0 [16];
  undefined1 *local_3b0 [2];
  undefined1 local_3a0 [16];
  undefined1 *local_390 [2];
  undefined1 local_380 [16];
  string local_370;
  undefined1 local_350 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  undefined1 local_2b0 [80];
  string local_260 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  undefined1 local_210 [80];
  string local_1c0 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  undefined1 local_170 [80];
  string local_120 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_57a = false;
  local_579 = false;
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  local_578._M_string_length = 0;
  local_578.field_2._M_local_buf[0] = '\0';
  local_428 = local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"Diagnostic options","");
  local_408.m_name._M_dataplus._M_p = (pointer)&local_408.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_408,local_428,local_428 + local_420);
  local_408.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_428 != local_418) {
    operator_delete(local_428);
  }
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"version","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_350,&local_448,&local_57a);
  local_468[0] = local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Version information","");
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&local_408,(typed_option<bool> *)local_350);
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"audit","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_170,&local_488,&all->audit);
  local_4a8[0] = local_498;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"a","");
  std::__cxx11::string::_M_assign(local_120);
  local_4c8[0] = local_4b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4c8,"print weights of features","");
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_170);
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"progress","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_210,&local_4e8,&local_578);
  local_508[0] = local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"P","");
  std::__cxx11::string::_M_assign(local_1c0);
  local_528[0] = local_518;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_528,"Progress update frequency. int: additive, float: multiplicative",
             "");
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar7,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_210);
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"quiet","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_d0,&local_370,&all->quiet);
  local_390[0] = local_380;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_390,"Don\'t output disgnostics and progress updates","");
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_d0);
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"help","");
  local_558 = &all->quiet;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2b0,&local_548,&local_579);
  local_3b0[0] = local_3a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"h","");
  local_550 = options;
  std::__cxx11::string::_M_assign(local_260);
  local_3d0[0] = local_3c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3d0,"Look here: http://hunch.net/~vw/ and click on Tutorial.","");
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar7,(typed_option<bool> *)local_2b0);
  if (local_3d0[0] != local_3c0) {
    operator_delete(local_3d0[0]);
  }
  if (local_3b0[0] != local_3a0) {
    operator_delete(local_3b0[0]);
  }
  local_2b0._0_8_ = &PTR__typed_option_002eaf88;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p);
  }
  if (local_390[0] != local_380) {
    operator_delete(local_390[0]);
  }
  local_d0._0_8_ = &PTR__typed_option_002eaf88;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  if (local_528[0] != local_518) {
    operator_delete(local_528[0]);
  }
  if (local_508[0] != local_4f8) {
    operator_delete(local_508[0]);
  }
  local_210._0_8_ = &PTR__typed_option_002eaff0;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p);
  }
  if (local_4c8[0] != local_4b8) {
    operator_delete(local_4c8[0]);
  }
  if (local_4a8[0] != local_498) {
    operator_delete(local_4a8[0]);
  }
  local_170._0_8_ = &PTR__typed_option_002eaf88;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p);
  }
  if (local_468[0] != local_458) {
    operator_delete(local_468[0]);
  }
  poVar5 = local_550;
  local_350._0_8_ = &PTR__typed_option_002eaf88;
  if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
  }
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p);
  }
  (**poVar5->_vptr_options_i)(poVar5,&local_408);
  if (local_57a != true) {
    pp_Var2 = (_func_int **)(local_350 + 0x10);
    local_350._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"progress","");
    iVar6 = (*poVar5->_vptr_options_i[1])(poVar5,local_350);
    if ((char)iVar6 == '\0') {
      if ((_func_int **)local_350._0_8_ != pp_Var2) {
        operator_delete((void *)local_350._0_8_);
      }
    }
    else {
      bVar3 = *local_558;
      if ((_func_int **)local_350._0_8_ != pp_Var2) {
        operator_delete((void *)local_350._0_8_);
      }
      if (bVar3 == false) {
        dVar4 = atof(local_578._M_dataplus._M_p);
        all->progress_arg = (float)dVar4;
        lVar8 = std::__cxx11::string::find_first_of((char *)&local_578,0x291cdf,0);
        if (lVar8 == -1) {
          all->progress_add = true;
          fVar10 = all->progress_arg;
          if (fVar10 < 1.0) {
            pvVar1 = &all->trace_message;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&pvVar1->super_ostream,"warning: additive --progress <int>",0x22);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&pvVar1->super_ostream," can\'t be < 1: forcing to 1",0x1b);
            std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
            std::ostream::put((char)pvVar1);
            std::ostream::flush();
            all->progress_arg = 1.0;
            fVar10 = 1.0;
          }
          all->sd->dump_interval = fVar10;
        }
        else {
          all->progress_add = false;
          if (all->progress_arg <= 1.0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (&(all->trace_message).super_ostream,
                       "warning: multiplicative --progress <float>: ",0x2c);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (&(all->trace_message).super_ostream,local_578._M_dataplus._M_p,
                                local_578._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," is <= 1.0: adding 1.0",0x16)
            ;
            std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            all->progress_arg = all->progress_arg + 1.0;
          }
          else if (9.0 < all->progress_arg) {
            pvVar1 = &all->trace_message;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&pvVar1->super_ostream,"warning: multiplicative --progress <float>",0x2a);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&pvVar1->super_ostream," is > 9.0: you probably meant to use an integer",0x2f
                      );
            std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
            std::ostream::put((char)pvVar1);
            std::ostream::flush();
          }
          all->sd->dump_interval = 1.0;
        }
      }
    }
    std::
    vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
    ::~vector(&local_408.m_options);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408.m_name._M_dataplus._M_p != &local_408.m_name.field_2) {
      operator_delete(local_408.m_name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p);
    }
    return;
  }
  version_struct::to_string_abi_cxx11_((string *)local_350,&version);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_350._0_8_,local_350._8_8_);
  std::operator<<(poVar9,"\n");
  std::__cxx11::string::~string((string *)local_350);
  exit(0);
}

Assistant:

void parse_diagnostics(options_i& options, vw& all)
{
  bool version_arg = false;
  bool help = false;
  std::string progress_arg;
  option_group_definition diagnostic_group("Diagnostic options");
  diagnostic_group.add(make_option("version", version_arg).help("Version information"))
      .add(make_option("audit", all.audit).short_name("a").help("print weights of features"))
      .add(make_option("progress", progress_arg)
               .short_name("P")
               .help("Progress update frequency. int: additive, float: multiplicative"))
      .add(make_option("quiet", all.quiet).help("Don't output disgnostics and progress updates"))
      .add(make_option("help", help).short_name("h").help("Look here: http://hunch.net/~vw/ and click on Tutorial."));

  options.add_and_parse(diagnostic_group);

  // Upon direct query for version -- spit it out to stdout
  if (version_arg)
  {
    cout << version.to_string() << "\n";
    exit(0);
  }

  if (options.was_supplied("progress") && !all.quiet)
  {
    all.progress_arg = (float)::atof(progress_arg.c_str());
    // --progress interval is dual: either integer or floating-point
    if (progress_arg.find_first_of(".") == string::npos)
    {
      // No "." in arg: assume integer -> additive
      all.progress_add = true;
      if (all.progress_arg < 1)
      {
        all.trace_message << "warning: additive --progress <int>"
                          << " can't be < 1: forcing to 1" << endl;
        all.progress_arg = 1;
      }
      all.sd->dump_interval = all.progress_arg;
    }
    else
    {
      // A "." in arg: assume floating-point -> multiplicative
      all.progress_add = false;

      if (all.progress_arg <= 1.0)
      {
        all.trace_message << "warning: multiplicative --progress <float>: " << progress_arg << " is <= 1.0: adding 1.0"
                          << endl;
        all.progress_arg += 1.0;
      }
      else if (all.progress_arg > 9.0)
      {
        all.trace_message << "warning: multiplicative --progress <float>"
                          << " is > 9.0: you probably meant to use an integer" << endl;
      }
      all.sd->dump_interval = 1.0;
    }
  }
}